

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

bool __thiscall ON_ObjRef_IRefID::Write(ON_ObjRef_IRefID *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,1);
  if (bVar1) {
    bVar2 = ON_BinaryArchive::WriteUuid(archive,&this->m_iref_uuid);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteXform(archive,&this->m_iref_xform);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::WriteUuid(archive,&this->m_idef_uuid);
        if (bVar2) {
          bVar2 = ON_BinaryArchive::WriteInt(archive,this->m_idef_geometry_index);
          if (bVar2) {
            bVar2 = ON_BinaryArchive::WriteComponentIndex(archive,&this->m_component_index);
            if (bVar2) {
              bVar2 = ON_ObjRefEvaluationParameter::Write(&this->m_evp,archive);
            }
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_ObjRef_IRefID::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 1 );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = archive.WriteUuid(m_iref_uuid);
    if (!rc) break;

    rc = archive.WriteXform(m_iref_xform);
    if (!rc) break;

    rc = archive.WriteUuid(m_idef_uuid);
    if (!rc) break;

    rc = archive.WriteInt(m_idef_geometry_index);
    if (!rc) break;

    // 13 July 2006 - 1.1 - added m_component_index and m_evp
    rc = archive.WriteComponentIndex(m_component_index);
    if (!rc) break;

    rc = m_evp.Write(archive);
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}